

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

char * luaG_findlocal(lua_State *L,CallInfo *ci,int n,StkId *pos)

{
  Proto *f;
  int pc;
  long lVar1;
  char *pcVar2;
  StkId local_60;
  StkId limit;
  char *name;
  StkId base;
  StkId *pos_local;
  int n_local;
  CallInfo *ci_local;
  lua_State *L_local;
  
  lVar1 = (ci->func).offset + 0x10;
  limit = (StkId)0x0;
  if ((ci->callstatus & 0x8000) == 0) {
    if (n < 0) {
      pcVar2 = findvararg(ci,n,pos);
      return pcVar2;
    }
    f = *(Proto **)((((ci->func).p)->val).value_.f + 0x18);
    pc = currentpc(ci);
    limit = (StkId)luaF_getlocalname(f,n,pc);
  }
  if (limit == (StkId)0x0) {
    if (ci == L->ci) {
      local_60 = (L->top).p;
    }
    else {
      local_60 = (ci->next->func).p;
    }
    if (((long)local_60 - lVar1 >> 4 < (long)n) || (n < 1)) {
      return (char *)0x0;
    }
    limit = (StkId)"(C temporary)";
    if ((ci->callstatus & 0x8000) == 0) {
      limit = (StkId)"(temporary)";
    }
  }
  if (pos != (StkId *)0x0) {
    *pos = (StkId)(lVar1 + (long)(n + -1) * 0x10);
  }
  return (char *)limit;
}

Assistant:

const char *luaG_findlocal (lua_State *L, CallInfo *ci, int n, StkId *pos) {
  StkId base = ci->func.p + 1;
  const char *name = NULL;
  if (isLua(ci)) {
    if (n < 0)  /* access to vararg values? */
      return findvararg(ci, n, pos);
    else
      name = luaF_getlocalname(ci_func(ci)->p, n, currentpc(ci));
  }
  if (name == NULL) {  /* no 'standard' name? */
    StkId limit = (ci == L->ci) ? L->top.p : ci->next->func.p;
    if (limit - base >= n && n > 0) {  /* is 'n' inside 'ci' stack? */
      /* generic name for any valid slot */
      name = isLua(ci) ? "(temporary)" : "(C temporary)";
    }
    else
      return NULL;  /* no name */
  }
  if (pos)
    *pos = base + (n - 1);
  return name;
}